

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int nghttp2_session_close_stream(nghttp2_session *session,int32_t stream_id,uint32_t error_code)

{
  long *plVar1;
  byte bVar2;
  nghttp2_on_stream_close_callback p_Var3;
  nghttp2_outbound_item *item_00;
  int iVar4;
  uint uVar5;
  nghttp2_stream *stream;
  long lVar6;
  nghttp2_outbound_item *item;
  
  stream = nghttp2_session_get_stream(session,stream_id);
  if (stream == (nghttp2_stream *)0x0) {
    return -0x1f5;
  }
  p_Var3 = (session->callbacks).on_stream_close_callback;
  if ((p_Var3 != (nghttp2_on_stream_close_callback)0x0) &&
     (iVar4 = (*p_Var3)(session,stream_id,error_code,session->user_data), iVar4 != 0)) {
    return -0x386;
  }
  item_00 = stream->item;
  if (((item_00 != (nghttp2_outbound_item *)0x0) &&
      (session_detach_stream_item(session,stream), item_00->queued == '\0')) &&
     (item_00 != (session->aob).item)) {
    nghttp2_outbound_item_free(item_00,&session->mem);
    nghttp2_mem_free(&session->mem,item_00);
  }
  if (stream_id == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = (uint)(session->server != '\0') ^ stream_id & 1U;
  }
  bVar2 = stream->flags;
  if ((bVar2 & 1) == 0) {
    lVar6 = (ulong)(uVar5 == 0) * 8 + 0xa88;
  }
  else {
    if (uVar5 != 0) goto LAB_0010a71c;
    lVar6 = 0xa98;
  }
  plVar1 = (long *)((long)&(session->streams).table + lVar6);
  *plVar1 = *plVar1 + -1;
LAB_0010a71c:
  stream->flags = bVar2 | 2;
  if (session->pending_no_rfc7540_priorities == '\x01') {
    iVar4 = nghttp2_session_destroy_stream(session,stream);
    return iVar4;
  }
  if ((((session->opt_flags & 0x10) == 0) && (session->server != '\0')) &&
     ((uVar5 == 0 && (iVar4 = nghttp2_stream_in_dep_tree(stream), iVar4 != 0)))) {
    nghttp2_session_keep_closed_stream(session,stream);
  }
  else {
    iVar4 = nghttp2_session_destroy_stream(session,stream);
    if (iVar4 != 0) {
      return iVar4;
    }
  }
  return 0;
}

Assistant:

int nghttp2_session_close_stream(nghttp2_session *session, int32_t stream_id,
                                 uint32_t error_code) {
  int rv;
  nghttp2_stream *stream;
  nghttp2_mem *mem;
  int is_my_stream_id;

  mem = &session->mem;
  stream = nghttp2_session_get_stream(session, stream_id);

  if (!stream) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  DEBUGF("stream: stream(%p)=%d close\n", stream, stream->stream_id);

  /* We call on_stream_close_callback even if stream->state is
     NGHTTP2_STREAM_INITIAL. This will happen while sending request
     HEADERS, a local endpoint receives RST_STREAM for that stream. It
     may be PROTOCOL_ERROR, but without notifying stream closure will
     hang the stream in a local endpoint.
  */

  if (session->callbacks.on_stream_close_callback) {
    if (session->callbacks.on_stream_close_callback(
          session, stream_id, error_code, session->user_data) != 0) {
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    }
  }

  if (stream->item) {
    nghttp2_outbound_item *item;

    item = stream->item;

    session_detach_stream_item(session, stream);

    /* If item is queued, it will be deleted when it is popped
       (nghttp2_session_prep_frame() will fail).  If session->aob.item
       points to this item, let active_outbound_item_reset()
       free the item. */
    if (!item->queued && item != session->aob.item) {
      nghttp2_outbound_item_free(item, mem);
      nghttp2_mem_free(mem, item);
    }
  }

  is_my_stream_id = nghttp2_session_is_my_stream_id(session, stream_id);

  /* pushed streams which is not opened yet is not counted toward max
     concurrent limits */
  if ((stream->flags & NGHTTP2_STREAM_FLAG_PUSH)) {
    if (!is_my_stream_id) {
      --session->num_incoming_reserved_streams;
    }
  } else {
    if (is_my_stream_id) {
      --session->num_outgoing_streams;
    } else {
      --session->num_incoming_streams;
    }
  }

  /* Closes both directions just in case they are not closed yet */
  stream->flags |= NGHTTP2_STREAM_FLAG_CLOSED;

  if (session->pending_no_rfc7540_priorities == 1) {
    return nghttp2_session_destroy_stream(session, stream);
  }

  if ((session->opt_flags & NGHTTP2_OPTMASK_NO_CLOSED_STREAMS) == 0 &&
      session->server && !is_my_stream_id &&
      nghttp2_stream_in_dep_tree(stream)) {
    /* On server side, retain stream at most MAX_CONCURRENT_STREAMS
       combined with the current active incoming streams to make
       dependency tree work better. */
    nghttp2_session_keep_closed_stream(session, stream);
  } else {
    rv = nghttp2_session_destroy_stream(session, stream);
    if (rv != 0) {
      return rv;
    }
  }

  return 0;
}